

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::onConfigChanged(Network *this,Config *config,Config *previousConfig)

{
  bool bVar1;
  size_t sVar2;
  IStrategy *pIVar3;
  socklen_t in_ECX;
  BaseConfig *in_RDX;
  sockaddr *__addr;
  int __fd;
  BaseConfig *in_RSI;
  Network *in_RDI;
  IStrategyListener *in_stack_00000050;
  Pools *in_stack_00000058;
  Pools *in_stack_ffffffffffffffc8;
  Pools *in_stack_ffffffffffffffd0;
  
  BaseConfig::pools(in_RSI);
  BaseConfig::pools(in_RDX);
  bVar1 = Pools::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    BaseConfig::pools(in_RSI);
    sVar2 = Pools::active((Pools *)in_RSI);
    if (sVar2 != 0) {
      (*in_RDI->m_strategy->_vptr_IStrategy[7])();
      BaseConfig::pools(in_RSI);
      Pools::print((Pools *)this);
      if (in_RDI->m_strategy != (IStrategy *)0x0) {
        (*in_RDI->m_strategy->_vptr_IStrategy[1])();
      }
      BaseConfig::pools(in_RSI);
      __fd = (int)in_RDI + 8;
      pIVar3 = Pools::createStrategy(in_stack_00000058,in_stack_00000050);
      in_RDI->m_strategy = pIVar3;
      connect(in_RDI,__fd,__addr,in_ECX);
    }
  }
  return;
}

Assistant:

void xmrig::Network::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->pools() == previousConfig->pools() || !config->pools().active()) {
        return;
    }

    m_strategy->stop();

    config->pools().print();

    delete m_strategy;
    m_strategy = config->pools().createStrategy(this);
    connect();
}